

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawExplicitDecal
          (PixelGameEngine *this,Decal *decal,vf2d *pos,vf2d *uv,Pixel *col,uint32_t elements)

{
  long lVar1;
  ulong __new_size;
  float fVar2;
  float fVar3;
  value_type local_a0;
  
  local_a0.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a0.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a0.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a0.uv.super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.uv.super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.mode = NORMAL;
  local_a0.points = 0;
  local_a0.pos.
  super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.uv.super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.pos.
  super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.pos.
  super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size = (ulong)elements;
  local_a0.decal = decal;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            (&local_a0.pos,__new_size);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            (&local_a0.uv,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(&local_a0.w,__new_size);
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::resize(&local_a0.tint,__new_size);
  for (lVar1 = 0; __new_size << 2 != lVar1; lVar1 = lVar1 + 4) {
    fVar2 = *(float *)((long)&pos->x + lVar1 * 2) * (this->vInvScreenSize).x;
    fVar3 = *(float *)((long)&pos->y + lVar1 * 2) * (this->vInvScreenSize).y;
    *(float *)((long)&(local_a0.pos.
                       super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->x + lVar1 * 2) =
         fVar2 + fVar2 + -1.0;
    *(float *)((long)&(local_a0.pos.
                       super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->y + lVar1 * 2) =
         -(fVar3 + fVar3 + -1.0);
    *(undefined8 *)
     ((long)&(local_a0.uv.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->x + lVar1 * 2) =
         *(undefined8 *)((long)&uv->x + lVar1 * 2);
    *(undefined4 *)
     ((long)&(local_a0.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
              super__Vector_impl_data._M_start)->field_0 + lVar1) =
         *(undefined4 *)((long)&col->field_0 + lVar1);
    *(undefined4 *)
     ((long)local_a0.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + lVar1) = 0x3f800000;
  }
  local_a0.points = elements;
  local_a0.mode = this->nDecalMode;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             &local_a0);
  DecalInstance::~DecalInstance(&local_a0);
  return;
}

Assistant:

void PixelGameEngine::DrawExplicitDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::vf2d *uv, const olc::Pixel *col, uint32_t elements)
	{
		DecalInstance di;
		di.decal = decal;
		di.pos.resize(elements);
		di.uv.resize(elements);
		di.w.resize(elements);
		di.tint.resize(elements);
		di.points = elements;
		for (uint32_t i = 0; i < elements; i++)
		{
			di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			di.uv[i] = uv[i];
			di.tint[i] = col[i];
			di.w[i] = 1.0f;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}